

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O2

bool bssl::ssl_encrypt_ticket(SSL_HANDSHAKE *hs,CBB *out,SSL_SESSION *session)

{
  SSL *pSVar1;
  SSL_TICKET_AEAD_METHOD *pSVar2;
  _Head_base<0UL,_ssl_ctx_st_*,_false> ctx;
  UniquePtr<bssl::TicketKey> UVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *puVar8;
  size_t len_00;
  EVP_CIPHER *cipher;
  EVP_MD *md;
  long lVar9;
  bool bStack_190;
  int len;
  uint8_t *ptr_1;
  UniquePtr<uint8_t> free_session_buf;
  uint8_t iv [16];
  size_t session_len;
  uint8_t *session_buf;
  uint8_t key_name [16];
  ScopedHMAC_CTX hctx;
  uint8_t *ptr;
  
  session_buf = (uint8_t *)0x0;
  iVar5 = SSL_SESSION_to_bytes_for_ticket(session,&session_buf,&session_len);
  puVar8 = session_buf;
  if (iVar5 == 0) {
    return false;
  }
  free_session_buf._M_t.super___uniq_ptr_impl<unsigned_char,_bssl::internal::Deleter>._M_t.
  super__Tuple_impl<0UL,_unsigned_char_*,_bssl::internal::Deleter>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl =
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)
       (__uniq_ptr_data<unsigned_char,_bssl::internal::Deleter,_true,_true>)session_buf;
  pSVar1 = hs->ssl;
  pSVar2 = ((pSVar1->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>.
            _M_t.super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->ticket_aead_method;
  if (pSVar2 != (SSL_TICKET_AEAD_METHOD *)0x0) {
    uVar7 = (*pSVar2->max_overhead)(pSVar1);
    if (CARRY8(uVar7,session_len)) {
      bStack_190 = false;
      ERR_put_error(0x10,0,0x45,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                    ,0x194);
    }
    else {
      iVar5 = CBB_reserve(out,&ptr,uVar7 + session_len);
      if (iVar5 == 0) {
        bStack_190 = false;
      }
      else {
        iVar5 = (*pSVar2->seal)(pSVar1,ptr,(size_t *)&hctx,uVar7 + session_len,puVar8,session_len);
        if (iVar5 == 0) {
          bStack_190 = false;
          ERR_put_error(0x10,0,0x114,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_session.cc"
                        ,0x19f);
        }
        else {
          iVar5 = CBB_did_write(out,(size_t)hctx.ctx_.md);
          bStack_190 = iVar5 != 0;
        }
      }
    }
    goto LAB_00159259;
  }
  EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)&ptr);
  HMAC_CTX_init((HMAC_CTX *)&hctx);
  if (session_len < 0xff80) {
    ctx._M_head_impl =
         (hs->ssl->session_ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t
         .super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
         super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl;
    if ((ctx._M_head_impl)->ticket_key_cb ==
        (_func_int_SSL_ptr_uint8_t_ptr_uint8_t_ptr_EVP_CIPHER_CTX_ptr_HMAC_CTX_ptr_int *)0x0) {
      bVar4 = ssl_ctx_rotate_ticket_encryption_key(ctx._M_head_impl);
      bStack_190 = false;
      if (bVar4) {
        ptr_1 = (uint8_t *)&(ctx._M_head_impl)->lock;
        CRYPTO_MUTEX_lock_read((CRYPTO_MUTEX *)ptr_1);
        iVar5 = RAND_bytes(iv,0x10);
        if (iVar5 != 0) {
          cipher = EVP_aes_128_cbc();
          iVar5 = EVP_EncryptInit_ex((EVP_CIPHER_CTX *)&ptr,cipher,(ENGINE *)0x0,
                                     (uchar *)((long)((ctx._M_head_impl)->ticket_key_current)._M_t +
                                              0x20),iv);
          if (iVar5 != 0) {
            UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
            super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
            super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                 ((ctx._M_head_impl)->ticket_key_current)._M_t;
            md = EVP_sha256();
            iVar5 = HMAC_Init_ex((HMAC_CTX *)&hctx,
                                 (void *)((long)UVar3._M_t.
                                                super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>
                                                .super__Head_base<0UL,_bssl::TicketKey_*,_false>.
                                                _M_head_impl + 0x10),0x10,md,(ENGINE *)0x0);
            if (iVar5 != 0) {
              UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl =
                   ((ctx._M_head_impl)->ticket_key_current)._M_t;
              key_name._0_8_ =
                   *(undefined8 *)
                    UVar3._M_t.super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
                    super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                    super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl;
              key_name._8_8_ =
                   *(undefined8 *)
                    ((long)UVar3._M_t.
                           super___uniq_ptr_impl<bssl::TicketKey,_bssl::internal::Deleter>._M_t.
                           super__Tuple_impl<0UL,_bssl::TicketKey_*,_bssl::internal::Deleter>.
                           super__Head_base<0UL,_bssl::TicketKey_*,_false>._M_head_impl + 8);
              internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::
              ~MutexLockBase((MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read> *)
                             &ptr_1);
              goto LAB_00159104;
            }
          }
        }
        internal::MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read>::~MutexLockBase
                  ((MutexLockBase<&CRYPTO_MUTEX_lock_read,_&CRYPTO_MUTEX_unlock_read> *)&ptr_1);
      }
    }
    else {
      bStack_190 = true;
      iVar5 = (*(ctx._M_head_impl)->ticket_key_cb)
                        (hs->ssl,key_name,iv,(EVP_CIPHER_CTX *)&ptr,&hctx.ctx_,1);
      if (iVar5 < 0) {
        bStack_190 = false;
      }
      else if (iVar5 != 0) {
LAB_00159104:
        iVar5 = CBB_add_bytes(out,key_name,0x10);
        bVar4 = false;
        bStack_190 = false;
        if (iVar5 != 0) {
          uVar6 = EVP_CIPHER_CTX_iv_length((EVP_CIPHER_CTX *)&ptr);
          iVar5 = CBB_add_bytes(out,iv,(ulong)uVar6);
          if (((iVar5 != 0) &&
              (iVar5 = CBB_reserve(out,&ptr_1,session_len + 0x20), bStack_190 = bVar4, iVar5 != 0))
             && (iVar5 = EVP_EncryptUpdate((EVP_CIPHER_CTX *)&ptr,ptr_1,&len,puVar8,(int)session_len
                                          ), iVar5 != 0)) {
            lVar9 = (long)len;
            iVar5 = EVP_EncryptFinal_ex((EVP_CIPHER_CTX *)&ptr,ptr_1 + lVar9,&len);
            if ((iVar5 != 0) && (iVar5 = CBB_did_write(out,len + lVar9), iVar5 != 0)) {
              puVar8 = CBB_data(out);
              len_00 = CBB_len(out);
              iVar5 = HMAC_Update((HMAC_CTX *)&hctx,puVar8,len_00);
              bStack_190 = false;
              if ((iVar5 != 0) &&
                 ((iVar5 = CBB_reserve(out,&ptr_1,0x40), iVar5 != 0 &&
                  (iVar5 = HMAC_Final((HMAC_CTX *)&hctx,ptr_1,(uint *)&len), iVar5 != 0)))) {
                iVar5 = CBB_did_write(out,(ulong)(uint)len);
                bStack_190 = iVar5 != 0;
              }
            }
          }
        }
      }
    }
  }
  else {
    bStack_190 = true;
  }
  internal::StackAllocated<hmac_ctx_st,_void,_&HMAC_CTX_init,_&HMAC_CTX_cleanup>::~StackAllocated
            (&hctx);
  internal::StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>::
  ~StackAllocated((StackAllocated<evp_cipher_ctx_st,_int,_&EVP_CIPHER_CTX_init,_&EVP_CIPHER_CTX_cleanup>
                   *)&ptr);
LAB_00159259:
  std::unique_ptr<unsigned_char,_bssl::internal::Deleter>::~unique_ptr(&free_session_buf);
  return bStack_190;
}

Assistant:

bool ssl_encrypt_ticket(SSL_HANDSHAKE *hs, CBB *out,
                        const SSL_SESSION *session) {
  // Serialize the SSL_SESSION to be encoded into the ticket.
  uint8_t *session_buf = nullptr;
  size_t session_len;
  if (!SSL_SESSION_to_bytes_for_ticket(session, &session_buf, &session_len)) {
    return false;
  }
  bssl::UniquePtr<uint8_t> free_session_buf(session_buf);

  if (hs->ssl->session_ctx->ticket_aead_method) {
    return ssl_encrypt_ticket_with_method(hs, out, session_buf, session_len);
  } else {
    return ssl_encrypt_ticket_with_cipher_ctx(hs, out, session_buf,
                                              session_len);
  }
}